

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

void __thiscall
flatbuffers::BinaryAnnotator::BuildVector
          (BinaryAnnotator *this,uint64_t vector_offset,Object *table,Field *field,
          uint64_t parent_table_offset,
          map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          *vtable_fields)

{
  ushort uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  uint64_t length;
  Object *pOVar4;
  undefined4 type;
  bool bVar5;
  uint16_t uVar6;
  BaseType BVar7;
  BinaryRegionType type_00;
  Type *pTVar8;
  String *pSVar9;
  char *pcVar10;
  unsigned_long *puVar11;
  uint64_t uVar12;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_00;
  Object *pOVar13;
  pointer ppVar14;
  unsigned_short *puVar15;
  uint *puVar16;
  size_t sVar17;
  uchar *puVar18;
  int __c;
  int __c_00;
  int __c_01;
  value_type *__x;
  Optional<unsigned_long> OVar19;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_1d00;
  allocator<char> local_1ce1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ca0;
  BinarySection local_1c80;
  BinaryRegionComment local_1c40;
  BinaryRegion local_1bc8;
  BinaryRegionComment local_1b28;
  BinaryRegion local_1ab0;
  allocator<char> local_1a09;
  string local_1a08;
  _Optional_payload_base<unsigned_char> local_19e2;
  undefined1 local_19e0 [6];
  Optional<unsigned_char> enum_value;
  BinaryRegion local_1968;
  string local_18c8;
  uint64_t local_18a8;
  uint64_t remaining_5;
  BinaryRegionComment vector_scalar_comment;
  size_t i_4;
  uint64_t type_size;
  undefined1 local_1810 [4];
  BinaryRegionType binary_region_type;
  BinaryRegion local_1798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16d8;
  undefined1 local_16b8 [8];
  string enum_type;
  BinaryRegion local_1620;
  allocator<char> local_1579;
  string local_1578;
  _Optional_payload_base<unsigned_char> local_1552;
  undefined1 local_1550 [6];
  Optional<unsigned_char> realized_type;
  BinaryRegion local_14d8;
  allocator<char> local_1431;
  string local_1430;
  Object *local_1410;
  uint64_t union_offset;
  BinaryRegion local_1390;
  allocator<char> local_12e9;
  string local_12e8;
  uint64_t local_12c8;
  uint64_t remaining_4;
  Optional<unsigned_int> union_relative_offset;
  BinaryRegionComment comment;
  size_t i_3;
  uint64_t union_type_vector_data_offset;
  BinaryRegion local_11b8;
  allocator<char> local_1111;
  string local_1110;
  undefined1 local_10f0 [8];
  BinaryRegionComment vector_union_comment;
  uint64_t remaining_3;
  uint64_t uStack_1068;
  Optional<unsigned_short> union_type_vector_field_relative_offset;
  uint64_t union_type_vector_field_offset;
  _Self local_1058;
  const_iterator vtable_entry;
  undefined1 local_1048 [6];
  uint16_t union_type_vector_id;
  BinaryRegion local_fd0;
  BinaryRegionComment local_f30;
  BinaryRegion local_eb8;
  allocator<char> local_e11;
  string local_e10;
  Object *local_df0;
  uint64_t string_offset;
  BinaryRegion local_d70;
  allocator<char> local_cc9;
  string local_cc8;
  uint64_t local_ca8;
  uint64_t remaining_2;
  Optional<unsigned_int> string_relative_offset;
  BinaryRegionComment vector_object_comment_1;
  size_t i_2;
  BinaryRegion local_ba0;
  BinaryRegionComment local_b00;
  BinaryRegion local_a88;
  allocator<char> local_9e1;
  string local_9e0;
  BinaryRegionComment local_9c0;
  BinaryRegion local_948;
  allocator<char> local_8a1;
  string local_8a0;
  Object *local_880;
  uint64_t table_offset;
  BinaryRegion local_800;
  allocator<char> local_759;
  string local_758;
  uint64_t local_738;
  uint64_t remaining_1;
  Optional<unsigned_int> table_relative_offset;
  BinaryRegionComment vector_object_comment;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  Object *local_648;
  uint64_t next_offset;
  size_t i;
  Object *object;
  uint64_t offset;
  BinaryRegion local_5b0;
  undefined1 local_510 [8];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  BinaryRegion local_480;
  allocator<char> local_3d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  BinarySection local_378;
  allocator<char> local_331;
  string local_330;
  long local_310;
  uint64_t last_item_offset;
  BinaryRegionComment local_300;
  BinaryRegion local_288;
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  BinarySection local_180;
  allocator<char> local_139;
  string local_138;
  uint64_t local_118;
  uint64_t remaining;
  Optional<unsigned_int> v_1;
  _Storage<unsigned_long,_true> local_f8;
  Optional<unsigned_long> v;
  BinaryRegionType local_e0;
  BinarySectionType section_type;
  BinaryRegionType region_type;
  uint32_t vector_length_size_type;
  Optional<uint64_t> vector_length;
  undefined1 local_b0 [7];
  bool is_64_bit_vector;
  BinaryRegionComment vector_length_comment;
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  *vtable_fields_local;
  uint64_t parent_table_offset_local;
  Field *field_local;
  Object *table_local;
  uint64_t vector_offset_local;
  BinaryAnnotator *this_local;
  
  vector_length_comment.index = (size_t)vtable_fields;
  bVar5 = ContainsSection(this,vector_offset);
  if (!bVar5) {
    BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_b0);
    vector_length_comment.status_message.field_2._8_4_ = 0x12;
    pTVar8 = reflection::Field::type(field);
    BVar7 = reflection::Type::base_type(pTVar8);
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&region_type);
    v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._12_4_ = 7;
    if (BVar7 == Vector64) {
      OVar19 = ReadScalar<unsigned_long>(this,vector_offset);
      local_f8._M_value =
           OVar19.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
           OVar19.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged;
      bVar5 = std::optional<unsigned_long>::has_value((optional<unsigned_long> *)&local_f8);
      if (bVar5) {
        puVar11 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&local_f8);
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)&v_1,puVar11);
        _region_type = (_Storage<unsigned_long,_true>)
                       v_1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>;
      }
      section_type = Union;
      local_e0 = Uint64;
      v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._12_4_ = 10;
    }
    else {
      remaining = (uint64_t)ReadScalar<unsigned_int>(this,vector_offset);
      bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&remaining);
      if (bVar5) {
        puVar16 = std::optional<unsigned_int>::value((optional<unsigned_int> *)&remaining);
        std::optional<unsigned_long>::operator=((optional<unsigned_long> *)&region_type,puVar16);
      }
      section_type = VTable;
      local_e0 = Uint32;
      v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._12_4_ = 7;
    }
    bVar5 = std::optional<unsigned_long>::has_value((optional<unsigned_long> *)&region_type);
    if (bVar5) {
      puVar11 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&region_type);
      uVar2 = *puVar11;
      uVar12 = GetElementSize(this,field);
      local_310 = vector_offset + section_type + uVar2 * uVar12;
      bVar5 = IsValidOffset(this,local_310 - 1);
      if (bVar5) {
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
                  ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                   local_510);
        BinaryRegionComment::BinaryRegionComment
                  ((BinaryRegionComment *)&offset,(BinaryRegionComment *)local_b0);
        anon_unknown_46::MakeBinaryRegion
                  (&local_5b0,vector_offset,(ulong)section_type,local_e0,0,0,
                   (BinaryRegionComment *)&offset);
        __x = &local_5b0;
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                  local_510,__x);
        BinaryRegion::~BinaryRegion(&local_5b0);
        BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&offset);
        object = (Object *)(vector_offset + section_type);
        pTVar8 = reflection::Field::type(field);
        BVar7 = reflection::Type::element(pTVar8);
        if (BVar7 == String) {
          for (vector_object_comment_1.index = 0;
              puVar11 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&region_type)
              , vector_object_comment_1.index < *puVar11;
              vector_object_comment_1.index = vector_object_comment_1.index + 1) {
            BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)&string_relative_offset)
            ;
            remaining_2 = (uint64_t)ReadScalar<unsigned_int>(this,(uint64_t)object);
            bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&remaining_2);
            pOVar13 = object;
            if (bVar5) {
              puVar16 = std::optional<unsigned_int>::value((optional<unsigned_int> *)&remaining_2);
              local_df0 = pOVar13 + *puVar16;
              bVar5 = IsValidOffset(this,(uint64_t)local_df0);
              pOVar4 = object;
              pOVar13 = local_df0;
              if (bVar5) {
                BinaryRegionComment::BinaryRegionComment
                          ((BinaryRegionComment *)local_1048,
                           (BinaryRegionComment *)&string_relative_offset);
                anon_unknown_46::MakeBinaryRegion
                          (&local_fd0,(uint64_t)pOVar4,4,UOffset,0,(uint64_t)pOVar13,
                           (BinaryRegionComment *)local_1048);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           *)local_510,&local_fd0);
                BinaryRegion::~BinaryRegion(&local_fd0);
                BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_1048);
                BuildString(this,(uint64_t)local_df0,table,field);
                object = object + 4;
                last_item_offset._4_4_ = 0;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e10,"",&local_e11);
                anon_unknown_46::SetError
                          ((BinaryRegionComment *)&string_relative_offset,ERROR_OFFSET_OUT_OF_BINARY
                           ,&local_e10);
                std::__cxx11::string::~string((string *)&local_e10);
                std::allocator<char>::~allocator(&local_e11);
                pOVar4 = object;
                pOVar13 = local_df0;
                BinaryRegionComment::BinaryRegionComment
                          (&local_f30,(BinaryRegionComment *)&string_relative_offset);
                anon_unknown_46::MakeBinaryRegion
                          (&local_eb8,(uint64_t)pOVar4,4,UOffset,0,(uint64_t)pOVar13,&local_f30);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           *)local_510,&local_eb8);
                BinaryRegion::~BinaryRegion(&local_eb8);
                BinaryRegionComment::~BinaryRegionComment(&local_f30);
                object = object + 4;
                last_item_offset._4_4_ = 0xb;
              }
            }
            else {
              local_ca8 = RemainingBytes(this,(uint64_t)object);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_cc8,"4",&local_cc9);
              anon_unknown_46::SetError
                        ((BinaryRegionComment *)&string_relative_offset,ERROR_INCOMPLETE_BINARY,
                         &local_cc8);
              std::__cxx11::string::~string((string *)&local_cc8);
              std::allocator<char>::~allocator(&local_cc9);
              pOVar13 = object;
              uVar12 = local_ca8;
              BinaryRegionComment::BinaryRegionComment
                        ((BinaryRegionComment *)&string_offset,
                         (BinaryRegionComment *)&string_relative_offset);
              anon_unknown_46::MakeBinaryRegion
                        (&local_d70,(uint64_t)pOVar13,uVar12,Unknown,uVar12,0,
                         (BinaryRegionComment *)&string_offset);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         *)local_510,&local_d70);
              BinaryRegion::~BinaryRegion(&local_d70);
              BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&string_offset);
              last_item_offset._4_4_ = 9;
            }
            BinaryRegionComment::~BinaryRegionComment
                      ((BinaryRegionComment *)&string_relative_offset);
            if ((last_item_offset._4_4_ != 0) && (last_item_offset._4_4_ == 9)) break;
          }
        }
        else if (BVar7 == Obj) {
          this_00 = reflection::Schema::objects(this->schema_);
          pTVar8 = reflection::Field::type(field);
          pcVar10 = reflection::Type::index(pTVar8,(char *)__x,__c);
          i = (size_t)Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                                (this_00,(uint)pcVar10);
          bVar5 = reflection::Object::is_struct((Object *)i);
          if (bVar5) {
            for (next_offset = 0; uVar12 = next_offset,
                puVar11 = std::optional<unsigned_long>::value
                                    ((optional<unsigned_long> *)&region_type), pOVar13 = object,
                uVar12 < *puVar11; next_offset = next_offset + 1) {
              NumToString<unsigned_long>((string *)&i_1,next_offset);
              std::operator+(&local_688,"[",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &i_1);
              std::operator+(&local_668,&local_688,"]");
              pOVar13 = (Object *)
                        BuildStruct(this,(uint64_t)pOVar13,
                                    (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                     *)local_510,&local_668,(Object *)i);
              std::__cxx11::string::~string((string *)&local_668);
              std::__cxx11::string::~string((string *)&local_688);
              std::__cxx11::string::~string((string *)&i_1);
              local_648 = pOVar13;
              if (pOVar13 == object) break;
              object = pOVar13;
            }
          }
          else {
            for (vector_object_comment.index = 0;
                puVar11 = std::optional<unsigned_long>::value
                                    ((optional<unsigned_long> *)&region_type),
                vector_object_comment.index < *puVar11;
                vector_object_comment.index = vector_object_comment.index + 1) {
              BinaryRegionComment::BinaryRegionComment
                        ((BinaryRegionComment *)&table_relative_offset);
              remaining_1 = (uint64_t)ReadScalar<unsigned_int>(this,(uint64_t)object);
              bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&remaining_1)
              ;
              pOVar13 = object;
              if (bVar5) {
                puVar16 = std::optional<unsigned_int>::value((optional<unsigned_int> *)&remaining_1)
                ;
                local_880 = pOVar13 + *puVar16;
                bVar5 = IsValidOffset(this,(uint64_t)local_880);
                pOVar4 = object;
                pOVar13 = local_880;
                if (bVar5) {
                  if (local_880 == (Object *)parent_table_offset) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_9e0,"",&local_9e1);
                    anon_unknown_46::SetError
                              ((BinaryRegionComment *)&table_relative_offset,ERROR_CYCLE_DETECTED,
                               &local_9e0);
                    std::__cxx11::string::~string((string *)&local_9e0);
                    std::allocator<char>::~allocator(&local_9e1);
                    pOVar4 = object;
                    pOVar13 = local_880;
                    BinaryRegionComment::BinaryRegionComment
                              (&local_b00,(BinaryRegionComment *)&table_relative_offset);
                    anon_unknown_46::MakeBinaryRegion
                              (&local_a88,(uint64_t)pOVar4,4,UOffset,0,(uint64_t)pOVar13,&local_b00)
                    ;
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_510,&local_a88);
                    BinaryRegion::~BinaryRegion(&local_a88);
                    BinaryRegionComment::~BinaryRegionComment(&local_b00);
                    object = object + 4;
                    last_item_offset._4_4_ = 8;
                  }
                  else {
                    BinaryRegionComment::BinaryRegionComment
                              ((BinaryRegionComment *)&i_2,
                               (BinaryRegionComment *)&table_relative_offset);
                    anon_unknown_46::MakeBinaryRegion
                              (&local_ba0,(uint64_t)pOVar4,4,UOffset,0,(uint64_t)pOVar13,
                               (BinaryRegionComment *)&i_2);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_510,&local_ba0);
                    BinaryRegion::~BinaryRegion(&local_ba0);
                    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&i_2);
                    object = object + 4;
                    BuildTable(this,(uint64_t)local_880,Table,(Object *)i);
                    last_item_offset._4_4_ = 0;
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_8a0,"",&local_8a1);
                  anon_unknown_46::SetError
                            ((BinaryRegionComment *)&table_relative_offset,
                             ERROR_OFFSET_OUT_OF_BINARY,&local_8a0);
                  std::__cxx11::string::~string((string *)&local_8a0);
                  std::allocator<char>::~allocator(&local_8a1);
                  pOVar4 = object;
                  pOVar13 = local_880;
                  BinaryRegionComment::BinaryRegionComment
                            (&local_9c0,(BinaryRegionComment *)&table_relative_offset);
                  anon_unknown_46::MakeBinaryRegion
                            (&local_948,(uint64_t)pOVar4,4,UOffset,0,(uint64_t)pOVar13,&local_9c0);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_510,&local_948);
                  BinaryRegion::~BinaryRegion(&local_948);
                  BinaryRegionComment::~BinaryRegionComment(&local_9c0);
                  object = object + 4;
                  last_item_offset._4_4_ = 8;
                }
              }
              else {
                local_738 = RemainingBytes(this,(uint64_t)object);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_758,"4",&local_759);
                anon_unknown_46::SetError
                          ((BinaryRegionComment *)&table_relative_offset,ERROR_INCOMPLETE_BINARY,
                           &local_758);
                std::__cxx11::string::~string((string *)&local_758);
                std::allocator<char>::~allocator(&local_759);
                pOVar13 = object;
                uVar12 = local_738;
                BinaryRegionComment::BinaryRegionComment
                          ((BinaryRegionComment *)&table_offset,
                           (BinaryRegionComment *)&table_relative_offset);
                anon_unknown_46::MakeBinaryRegion
                          (&local_800,(uint64_t)pOVar13,uVar12,Unknown,uVar12,0,
                           (BinaryRegionComment *)&table_offset);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           *)local_510,&local_800);
                BinaryRegion::~BinaryRegion(&local_800);
                BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&table_offset);
                last_item_offset._4_4_ = 6;
              }
              BinaryRegionComment::~BinaryRegionComment
                        ((BinaryRegionComment *)&table_relative_offset);
              if ((last_item_offset._4_4_ != 0) && (last_item_offset._4_4_ == 6)) break;
            }
          }
        }
        else if (BVar7 == Union) {
          uVar6 = reflection::Field::id(field);
          vtable_entry._M_node._6_2_ = uVar6 - 1;
          local_1058._M_node =
               (_Base_ptr)
               std::
               map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
               ::find(vtable_fields,(key_type_conflict *)((long)&vtable_entry._M_node + 6));
          union_type_vector_field_offset =
               (uint64_t)
               std::
               map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
               ::end(vtable_fields);
          bVar5 = std::operator==(&local_1058,(_Self *)&union_type_vector_field_offset);
          if (!bVar5) {
            ppVar14 = std::
                      _Rb_tree_const_iterator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>
                      ::operator->(&local_1058);
            uStack_1068 = parent_table_offset + (ppVar14->second).offset_from_table;
            remaining_3._4_4_ =
                 (_Optional_payload_base<unsigned_short>)
                 ReadScalar<unsigned_short>(this,uStack_1068);
            bVar5 = std::optional<unsigned_short>::has_value
                              ((optional<unsigned_short> *)((long)&remaining_3 + 4));
            uVar12 = uStack_1068;
            if (bVar5) {
              puVar15 = std::optional<unsigned_short>::value
                                  ((optional<unsigned_short> *)((long)&remaining_3 + 4));
              uVar1 = *puVar15;
              for (comment.index = 0; sVar17 = comment.index,
                  puVar11 = std::optional<unsigned_long>::value
                                      ((optional<unsigned_long> *)&region_type), sVar17 < *puVar11;
                  comment.index = comment.index + 1) {
                BinaryRegionComment::BinaryRegionComment
                          ((BinaryRegionComment *)&union_relative_offset);
                comment.status_message.field_2._8_4_ = 0x16;
                comment.default_value.field_2._8_8_ = comment.index;
                remaining_4 = (uint64_t)ReadScalar<unsigned_int>(this,(uint64_t)object);
                bVar5 = std::optional<unsigned_int>::has_value
                                  ((optional<unsigned_int> *)&remaining_4);
                pOVar13 = object;
                if (bVar5) {
                  puVar16 = std::optional<unsigned_int>::value
                                      ((optional<unsigned_int> *)&remaining_4);
                  local_1410 = pOVar13 + *puVar16;
                  bVar5 = IsValidOffset(this,(uint64_t)local_1410);
                  if (bVar5) {
                    pcVar10 = (char *)(uVar12 + uVar1 + 4 + comment.index);
                    local_1552 = (_Optional_payload_base<unsigned_char>)
                                 ReadScalar<unsigned_char>(this,(uint64_t)pcVar10);
                    bVar5 = std::optional<unsigned_char>::has_value
                                      ((optional<unsigned_char> *)&local_1552);
                    if (bVar5) {
                      ppVar14 = std::
                                _Rb_tree_const_iterator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                ::operator->(&local_1058);
                      pTVar8 = reflection::Field::type((ppVar14->second).field);
                      pcVar10 = reflection::Type::index(pTVar8,pcVar10,__c_00);
                      puVar18 = std::optional<unsigned_char>::value
                                          ((optional<unsigned_char> *)&local_1552);
                      bVar5 = IsValidUnionValue(this,(uint32_t)pcVar10,*puVar18);
                      pOVar13 = local_1410;
                      if (bVar5) {
                        puVar18 = std::optional<unsigned_char>::value
                                            ((optional<unsigned_char> *)&local_1552);
                        BuildUnion_abi_cxx11_
                                  ((string *)local_16b8,this,(uint64_t)pOVar13,*puVar18,field);
                        std::operator+(&local_16f8,"(`",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_16b8);
                        std::operator+(&local_16d8,&local_16f8,"`)");
                        std::__cxx11::string::operator=
                                  ((string *)(comment.name.field_2._M_local_buf + 8),
                                   (string *)&local_16d8);
                        std::__cxx11::string::~string((string *)&local_16d8);
                        std::__cxx11::string::~string((string *)&local_16f8);
                        pOVar4 = object;
                        pOVar13 = local_1410;
                        BinaryRegionComment::BinaryRegionComment
                                  ((BinaryRegionComment *)local_1810,
                                   (BinaryRegionComment *)&union_relative_offset);
                        anon_unknown_46::MakeBinaryRegion
                                  (&local_1798,(uint64_t)pOVar4,4,UOffset,0,(uint64_t)pOVar13,
                                   (BinaryRegionComment *)local_1810);
                        std::
                        vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                     *)local_510,&local_1798);
                        BinaryRegion::~BinaryRegion(&local_1798);
                        BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_1810)
                        ;
                        object = object + 4;
                        std::__cxx11::string::~string((string *)local_16b8);
                        last_item_offset._4_4_ = 0;
                      }
                      else {
                        object = object + 4;
                        last_item_offset._4_4_ = 0xe;
                      }
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_1578,"1",&local_1579);
                      anon_unknown_46::SetError
                                ((BinaryRegionComment *)&union_relative_offset,
                                 ERROR_INCOMPLETE_BINARY,&local_1578);
                      std::__cxx11::string::~string((string *)&local_1578);
                      std::allocator<char>::~allocator(&local_1579);
                      pOVar13 = object;
                      BinaryRegionComment::BinaryRegionComment
                                ((BinaryRegionComment *)((long)&enum_type.field_2 + 8),
                                 (BinaryRegionComment *)&union_relative_offset);
                      anon_unknown_46::MakeBinaryRegion
                                (&local_1620,(uint64_t)pOVar13,0,Unknown,0,0,
                                 (BinaryRegionComment *)((long)&enum_type.field_2 + 8));
                      std::
                      vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                   *)local_510,&local_1620);
                      BinaryRegion::~BinaryRegion(&local_1620);
                      BinaryRegionComment::~BinaryRegionComment
                                ((BinaryRegionComment *)((long)&enum_type.field_2 + 8));
                      last_item_offset._4_4_ = 0xe;
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1430,"",&local_1431);
                    anon_unknown_46::SetError
                              ((BinaryRegionComment *)&union_relative_offset,
                               ERROR_OFFSET_OUT_OF_BINARY,&local_1430);
                    std::__cxx11::string::~string((string *)&local_1430);
                    std::allocator<char>::~allocator(&local_1431);
                    pOVar4 = object;
                    pOVar13 = local_1410;
                    BinaryRegionComment::BinaryRegionComment
                              ((BinaryRegionComment *)local_1550,
                               (BinaryRegionComment *)&union_relative_offset);
                    anon_unknown_46::MakeBinaryRegion
                              (&local_14d8,(uint64_t)pOVar4,4,UOffset,0,(uint64_t)pOVar13,
                               (BinaryRegionComment *)local_1550);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_510,&local_14d8);
                    BinaryRegion::~BinaryRegion(&local_14d8);
                    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_1550);
                    last_item_offset._4_4_ = 0xe;
                  }
                }
                else {
                  local_12c8 = RemainingBytes(this,(uint64_t)object);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_12e8,"4",&local_12e9);
                  anon_unknown_46::SetError
                            ((BinaryRegionComment *)&union_relative_offset,ERROR_INCOMPLETE_BINARY,
                             &local_12e8);
                  std::__cxx11::string::~string((string *)&local_12e8);
                  std::allocator<char>::~allocator(&local_12e9);
                  pOVar13 = object;
                  length = local_12c8;
                  BinaryRegionComment::BinaryRegionComment
                            ((BinaryRegionComment *)&union_offset,
                             (BinaryRegionComment *)&union_relative_offset);
                  anon_unknown_46::MakeBinaryRegion
                            (&local_1390,(uint64_t)pOVar13,length,Unknown,length,0,
                             (BinaryRegionComment *)&union_offset);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_510,&local_1390);
                  BinaryRegion::~BinaryRegion(&local_1390);
                  BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&union_offset);
                  last_item_offset._4_4_ = 0xc;
                }
                BinaryRegionComment::~BinaryRegionComment
                          ((BinaryRegionComment *)&union_relative_offset);
                if ((last_item_offset._4_4_ != 0) && (last_item_offset._4_4_ == 0xc)) break;
              }
            }
            else {
              vector_union_comment.index = RemainingBytes(this,(uint64_t)object);
              BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_10f0);
              vector_union_comment.status_message.field_2._8_4_ = 0x16;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1110,"2",&local_1111);
              anon_unknown_46::SetError
                        ((BinaryRegionComment *)local_10f0,ERROR_INCOMPLETE_BINARY,&local_1110);
              std::__cxx11::string::~string((string *)&local_1110);
              std::allocator<char>::~allocator(&local_1111);
              pOVar13 = object;
              sVar17 = vector_union_comment.index;
              BinaryRegionComment::BinaryRegionComment
                        ((BinaryRegionComment *)&union_type_vector_data_offset,
                         (BinaryRegionComment *)local_10f0);
              anon_unknown_46::MakeBinaryRegion
                        (&local_11b8,(uint64_t)pOVar13,sVar17,Unknown,sVar17,0,
                         (BinaryRegionComment *)&union_type_vector_data_offset);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         *)local_510,&local_11b8);
              BinaryRegion::~BinaryRegion(&local_11b8);
              BinaryRegionComment::~BinaryRegionComment
                        ((BinaryRegionComment *)&union_type_vector_data_offset);
              last_item_offset._4_4_ = 2;
              BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_10f0);
            }
          }
        }
        else {
          pTVar8 = reflection::Field::type(field);
          BVar7 = reflection::Type::element(pTVar8);
          bVar5 = IsScalar(BVar7);
          if (bVar5) {
            pTVar8 = reflection::Field::type(field);
            BVar7 = reflection::Type::element(pTVar8);
            type_00 = GetRegionType(BVar7);
            pTVar8 = reflection::Field::type(field);
            BVar7 = reflection::Type::element(pTVar8);
            sVar17 = GetTypeSize(BVar7);
            for (vector_scalar_comment.index = 0; sVar3 = vector_scalar_comment.index,
                puVar11 = std::optional<unsigned_long>::value
                                    ((optional<unsigned_long> *)&region_type), sVar3 < *puVar11;
                vector_scalar_comment.index = vector_scalar_comment.index + 1) {
              BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)&remaining_5);
              vector_scalar_comment.status_message.field_2._8_4_ = 0x13;
              vector_scalar_comment.default_value.field_2._8_8_ = vector_scalar_comment.index;
              bVar5 = IsValidRead(this,(uint64_t)object,sVar17);
              if (bVar5) {
                pTVar8 = reflection::Field::type(field);
                BVar7 = reflection::Type::element(pTVar8);
                bVar5 = IsUnionType(this,BVar7);
                if (bVar5) {
                  pOVar13 = object;
                  local_19e2 = (_Optional_payload_base<unsigned_char>)
                               ReadScalar<unsigned_char>(this,(uint64_t)object);
                  pTVar8 = reflection::Field::type(field);
                  pcVar10 = reflection::Type::index(pTVar8,(char *)pOVar13,__c_01);
                  puVar18 = std::optional<unsigned_char>::value
                                      ((optional<unsigned_char> *)&local_19e2);
                  bVar5 = IsValidUnionValue(this,(uint32_t)pcVar10,*puVar18);
                  if (!bVar5) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1a08,"",&local_1a09);
                    anon_unknown_46::SetError
                              ((BinaryRegionComment *)&remaining_5,ERROR_INVALID_UNION_TYPE,
                               &local_1a08);
                    std::__cxx11::string::~string((string *)&local_1a08);
                    std::allocator<char>::~allocator(&local_1a09);
                    pOVar13 = object;
                    BinaryRegionComment::BinaryRegionComment
                              (&local_1b28,(BinaryRegionComment *)&remaining_5);
                    anon_unknown_46::MakeBinaryRegion
                              (&local_1ab0,(uint64_t)pOVar13,sVar17,type_00,0,0,&local_1b28);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_510,&local_1ab0);
                    BinaryRegion::~BinaryRegion(&local_1ab0);
                    BinaryRegionComment::~BinaryRegionComment(&local_1b28);
                    object = object + sVar17;
                    last_item_offset._4_4_ = 0x11;
                    goto LAB_003a4b71;
                  }
                }
                pOVar13 = object;
                BinaryRegionComment::BinaryRegionComment
                          (&local_1c40,(BinaryRegionComment *)&remaining_5);
                anon_unknown_46::MakeBinaryRegion
                          (&local_1bc8,(uint64_t)pOVar13,sVar17,type_00,0,0,&local_1c40);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           *)local_510,&local_1bc8);
                BinaryRegion::~BinaryRegion(&local_1bc8);
                BinaryRegionComment::~BinaryRegionComment(&local_1c40);
                object = object + sVar17;
                last_item_offset._4_4_ = 0;
              }
              else {
                local_18a8 = RemainingBytes(this,(uint64_t)object);
                std::__cxx11::to_string(&local_18c8,sVar17);
                anon_unknown_46::SetError
                          ((BinaryRegionComment *)&remaining_5,ERROR_INCOMPLETE_BINARY,&local_18c8);
                std::__cxx11::string::~string((string *)&local_18c8);
                pOVar13 = object;
                uVar12 = local_18a8;
                BinaryRegionComment::BinaryRegionComment
                          ((BinaryRegionComment *)local_19e0,(BinaryRegionComment *)&remaining_5);
                anon_unknown_46::MakeBinaryRegion
                          (&local_1968,(uint64_t)pOVar13,uVar12,Unknown,uVar12,0,
                           (BinaryRegionComment *)local_19e0);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           *)local_510,&local_1968);
                BinaryRegion::~BinaryRegion(&local_1968);
                BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_19e0);
                last_item_offset._4_4_ = 0xf;
              }
LAB_003a4b71:
              BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&remaining_5);
              if ((last_item_offset._4_4_ != 0) && (last_item_offset._4_4_ == 0xf)) break;
            }
          }
        }
        pSVar9 = reflection::Object::name(table);
        pcVar10 = String::c_str(pSVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1ce0,pcVar10,&local_1ce1);
        std::operator+(&local_1cc0,&local_1ce0,".");
        pSVar9 = reflection::Field::name(field);
        pcVar10 = String::c_str(pSVar9);
        std::operator+(&local_1ca0,&local_1cc0,pcVar10);
        type = v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._12_4_;
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
                  (&local_1d00,
                   (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                   local_510);
        anon_unknown_46::MakeBinarySection(&local_1c80,&local_1ca0,type,&local_1d00);
        AddSection(this,vector_offset,&local_1c80);
        BinarySection::~BinarySection(&local_1c80);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_1d00);
        std::__cxx11::string::~string((string *)&local_1ca0);
        std::__cxx11::string::~string((string *)&local_1cc0);
        std::__cxx11::string::~string((string *)&local_1ce0);
        std::allocator<char>::~allocator(&local_1ce1);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                   local_510);
        last_item_offset._4_4_ = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_331);
        anon_unknown_46::SetError((BinaryRegionComment *)local_b0,ERROR_LENGTH_TOO_LONG,&local_330);
        std::__cxx11::string::~string((string *)&local_330);
        std::allocator<char>::~allocator(&local_331);
        pSVar9 = reflection::Object::name(table);
        pcVar10 = String::c_str(pSVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,pcVar10,&local_3d9);
        std::operator+(&local_3b8,&local_3d8,".");
        pSVar9 = reflection::Field::name(field);
        pcVar10 = String::c_str(pSVar9);
        std::operator+(&local_398,&local_3b8,pcVar10);
        BinaryRegionComment::BinaryRegionComment
                  ((BinaryRegionComment *)
                   &regions.
                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (BinaryRegionComment *)local_b0);
        anon_unknown_46::MakeBinaryRegion
                  (&local_480,vector_offset,(ulong)section_type,local_e0,0,0,
                   (BinaryRegionComment *)
                   &regions.
                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        anon_unknown_46::MakeSingleRegionBinarySection(&local_378,&local_398,Vector,&local_480);
        AddSection(this,vector_offset,&local_378);
        BinarySection::~BinarySection(&local_378);
        BinaryRegion::~BinaryRegion(&local_480);
        BinaryRegionComment::~BinaryRegionComment
                  ((BinaryRegionComment *)
                   &regions.
                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::allocator<char>::~allocator(&local_3d9);
        last_item_offset._4_4_ = 1;
      }
    }
    else {
      local_118 = RemainingBytes(this,vector_offset);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"4",&local_139);
      anon_unknown_46::SetError((BinaryRegionComment *)local_b0,ERROR_INCOMPLETE_BINARY,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
      pSVar9 = reflection::Object::name(table);
      pcVar10 = String::c_str(pSVar9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,pcVar10,&local_1e1);
      std::operator+(&local_1c0,&local_1e0,".");
      pSVar9 = reflection::Field::name(field);
      pcVar10 = String::c_str(pSVar9);
      std::operator+(&local_1a0,&local_1c0,pcVar10);
      uVar12 = local_118;
      BinaryRegionComment::BinaryRegionComment(&local_300,(BinaryRegionComment *)local_b0);
      anon_unknown_46::MakeBinaryRegion(&local_288,vector_offset,uVar12,Unknown,uVar12,0,&local_300)
      ;
      anon_unknown_46::MakeSingleRegionBinarySection(&local_180,&local_1a0,Vector,&local_288);
      AddSection(this,vector_offset,&local_180);
      BinarySection::~BinarySection(&local_180);
      BinaryRegion::~BinaryRegion(&local_288);
      BinaryRegionComment::~BinaryRegionComment(&local_300);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      last_item_offset._4_4_ = 1;
    }
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_b0);
  }
  return;
}

Assistant:

void BinaryAnnotator::BuildVector(
    const uint64_t vector_offset, const reflection::Object *const table,
    const reflection::Field *const field, const uint64_t parent_table_offset,
    const std::map<uint16_t, VTable::Entry> vtable_fields) {
  if (ContainsSection(vector_offset)) { return; }

  BinaryRegionComment vector_length_comment;
  vector_length_comment.type = BinaryRegionCommentType::VectorLength;

  const bool is_64_bit_vector =
      field->type()->base_type() == reflection::BaseType::Vector64;

  flatbuffers::Optional<uint64_t> vector_length;
  uint32_t vector_length_size_type = 0;
  BinaryRegionType region_type = BinaryRegionType::Uint32;
  BinarySectionType section_type = BinarySectionType::Vector;

  if (is_64_bit_vector) {
    auto v = ReadScalar<uint64_t>(vector_offset);
    if (v.has_value()) { vector_length = v.value(); }
    vector_length_size_type = sizeof(uint64_t);
    region_type = BinaryRegionType::Uint64;
    section_type = BinarySectionType::Vector64;
  } else {
    auto v = ReadScalar<uint32_t>(vector_offset);
    if (v.has_value()) { vector_length = v.value(); }
    vector_length_size_type = sizeof(uint32_t);
    region_type = BinaryRegionType::Uint32;
    section_type = BinarySectionType::Vector;
  }

  if (!vector_length.has_value()) {
    const uint64_t remaining = RemainingBytes(vector_offset);
    SetError(vector_length_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    AddSection(
        vector_offset,
        MakeSingleRegionBinarySection(
            std::string(table->name()->c_str()) + "." + field->name()->c_str(),
            BinarySectionType::Vector,
            MakeBinaryRegion(vector_offset, remaining,
                             BinaryRegionType::Unknown, remaining, 0,
                             vector_length_comment)));
    return;
  }

  // Validate there are enough bytes left in the binary to process all the
  // items.
  const uint64_t last_item_offset =
      vector_offset + vector_length_size_type +
      vector_length.value() * GetElementSize(field);

  if (!IsValidOffset(last_item_offset - 1)) {
    SetError(vector_length_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
    AddSection(
        vector_offset,
        MakeSingleRegionBinarySection(
            std::string(table->name()->c_str()) + "." + field->name()->c_str(),
            BinarySectionType::Vector,
            MakeBinaryRegion(vector_offset, vector_length_size_type,
                             region_type, 0, 0, vector_length_comment)));

    return;
  }

  std::vector<BinaryRegion> regions;

  regions.push_back(MakeBinaryRegion(vector_offset, vector_length_size_type,
                                     region_type, 0, 0, vector_length_comment));
  // Consume the vector length offset.
  uint64_t offset = vector_offset + vector_length_size_type;

  switch (field->type()->element()) {
    case reflection::BaseType::Obj: {
      const reflection::Object *object =
          schema_->objects()->Get(field->type()->index());

      if (object->is_struct()) {
        // Vector of structs
        for (size_t i = 0; i < vector_length.value(); ++i) {
          // Structs are inline to the vector.
          const uint64_t next_offset =
              BuildStruct(offset, regions, "[" + NumToString(i) + "]", object);
          if (next_offset == offset) { break; }
          offset = next_offset;
        }
      } else {
        // Vector of objects
        for (size_t i = 0; i < vector_length.value(); ++i) {
          BinaryRegionComment vector_object_comment;
          vector_object_comment.type =
              BinaryRegionCommentType::VectorTableValue;
          vector_object_comment.index = i;

          const auto table_relative_offset = ReadScalar<uint32_t>(offset);
          if (!table_relative_offset.has_value()) {
            const uint64_t remaining = RemainingBytes(offset);
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

            regions.push_back(
                MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                                 remaining, 0, vector_object_comment));
            break;
          }

          // The table offset is relative from the offset location itself.
          const uint64_t table_offset = offset + table_relative_offset.value();

          if (!IsValidOffset(table_offset)) {
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
            regions.push_back(MakeBinaryRegion(
                offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
                table_offset, vector_object_comment));

            offset += sizeof(uint32_t);
            continue;
          }

          if (table_offset == parent_table_offset) {
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_CYCLE_DETECTED);
            // A cycle detected where a table vector field is pointing to
            // itself. This should only happen in corrupted files.
            regions.push_back(MakeBinaryRegion(
                offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
                table_offset, vector_object_comment));

            offset += sizeof(uint32_t);
            continue;
          }

          regions.push_back(MakeBinaryRegion(
              offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
              table_offset, vector_object_comment));

          // Consume the offset to the table.
          offset += sizeof(uint32_t);

          BuildTable(table_offset, BinarySectionType::Table, object);
        }
      }
    } break;
    case reflection::BaseType::String: {
      // Vector of strings
      for (size_t i = 0; i < vector_length.value(); ++i) {
        BinaryRegionComment vector_object_comment;
        vector_object_comment.type = BinaryRegionCommentType::VectorStringValue;
        vector_object_comment.index = i;

        const auto string_relative_offset = ReadScalar<uint32_t>(offset);
        if (!string_relative_offset.has_value()) {
          const uint64_t remaining = RemainingBytes(offset);

          SetError(vector_object_comment,
                   BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

          regions.push_back(
              MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                               remaining, 0, vector_object_comment));
          break;
        }

        // The string offset is relative from the offset location itself.
        const uint64_t string_offset = offset + string_relative_offset.value();

        if (!IsValidOffset(string_offset)) {
          SetError(vector_object_comment,
                   BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
          regions.push_back(MakeBinaryRegion(
              offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
              string_offset, vector_object_comment));

          offset += sizeof(uint32_t);
          continue;
        }

        regions.push_back(MakeBinaryRegion(
            offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
            string_offset, vector_object_comment));

        BuildString(string_offset, table, field);

        offset += sizeof(uint32_t);
      }
    } break;
    case reflection::BaseType::Union: {
      // Vector of unions
      // Unions have both their realized type (uint8_t for now) that are
      // stored separately. These are stored in the field->index() - 1
      // location.
      const uint16_t union_type_vector_id = field->id() - 1;

      auto vtable_entry = vtable_fields.find(union_type_vector_id);
      if (vtable_entry == vtable_fields.end()) {
        // TODO(dbaileychess): need to capture this error condition.
        break;
      }

      const uint64_t union_type_vector_field_offset =
          parent_table_offset + vtable_entry->second.offset_from_table;

      const auto union_type_vector_field_relative_offset =
          ReadScalar<uint16_t>(union_type_vector_field_offset);

      if (!union_type_vector_field_relative_offset.has_value()) {
        const uint64_t remaining = RemainingBytes(offset);
        BinaryRegionComment vector_union_comment;
        vector_union_comment.type = BinaryRegionCommentType::VectorUnionValue;
        SetError(vector_union_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");

        regions.push_back(MakeBinaryRegion(offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, vector_union_comment));

        break;
      }

      // Get the offset to the first type (the + sizeof(uint32_t) is to skip
      // over the vector length which we already know). Validation happens
      // within the loop below.
      const uint64_t union_type_vector_data_offset =
          union_type_vector_field_offset +
          union_type_vector_field_relative_offset.value() + sizeof(uint32_t);

      for (size_t i = 0; i < vector_length.value(); ++i) {
        BinaryRegionComment comment;
        comment.type = BinaryRegionCommentType::VectorUnionValue;
        comment.index = i;

        const auto union_relative_offset = ReadScalar<uint32_t>(offset);
        if (!union_relative_offset.has_value()) {
          const uint64_t remaining = RemainingBytes(offset);

          SetError(comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

          regions.push_back(MakeBinaryRegion(offset, remaining,
                                             BinaryRegionType::Unknown,
                                             remaining, 0, comment));

          break;
        }

        // The union offset is relative from the offset location itself.
        const uint64_t union_offset = offset + union_relative_offset.value();

        if (!IsValidOffset(union_offset)) {
          SetError(comment, BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);

          regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                             BinaryRegionType::UOffset, 0,
                                             union_offset, comment));
          continue;
        }

        const auto realized_type =
            ReadScalar<uint8_t>(union_type_vector_data_offset + i);

        if (!realized_type.has_value()) {
          SetError(comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "1");
          regions.push_back(MakeBinaryRegion(
              offset, 0, BinaryRegionType::Unknown, 0, 0, comment));
          continue;
        }

        if (!IsValidUnionValue(vtable_entry->second.field->type()->index(),
                               realized_type.value())) {
          // We already export an error in the union type field, so just skip
          // building the union itself and it will default to an unreference
          // Binary section.
          offset += sizeof(uint32_t);
          continue;
        }

        const std::string enum_type =
            BuildUnion(union_offset, realized_type.value(), field);

        comment.default_value = "(`" + enum_type + "`)";
        regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                           BinaryRegionType::UOffset, 0,
                                           union_offset, comment));

        offset += sizeof(uint32_t);
      }
    } break;
    default: {
      if (IsScalar(field->type()->element())) {
        const BinaryRegionType binary_region_type =
            GetRegionType(field->type()->element());

        const uint64_t type_size = GetTypeSize(field->type()->element());

        // TODO(dbaileychess): It might be nicer to user the
        // BinaryRegion.array_length field to indicate this.
        for (size_t i = 0; i < vector_length.value(); ++i) {
          BinaryRegionComment vector_scalar_comment;
          vector_scalar_comment.type = BinaryRegionCommentType::VectorValue;
          vector_scalar_comment.index = i;

          if (!IsValidRead(offset, type_size)) {
            const uint64_t remaining = RemainingBytes(offset);

            SetError(vector_scalar_comment,
                     BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                     std::to_string(type_size));

            regions.push_back(
                MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                                 remaining, 0, vector_scalar_comment));
            break;
          }

          if (IsUnionType(field->type()->element())) {
            // This is a type for a union. Validate the value
            const auto enum_value = ReadScalar<uint8_t>(offset);

            // This should always have a value, due to the IsValidRead check
            // above.
            if (!IsValidUnionValue(field->type()->index(),
                                   enum_value.value())) {
              SetError(vector_scalar_comment,
                       BinaryRegionStatus::ERROR_INVALID_UNION_TYPE);
              regions.push_back(MakeBinaryRegion(offset, type_size,
                                                 binary_region_type, 0, 0,
                                                 vector_scalar_comment));
              offset += type_size;
              continue;
            }
          }

          regions.push_back(MakeBinaryRegion(offset, type_size,
                                             binary_region_type, 0, 0,
                                             vector_scalar_comment));
          offset += type_size;
        }
      }
    } break;
  }
  AddSection(vector_offset,
             MakeBinarySection(std::string(table->name()->c_str()) + "." +
                                   field->name()->c_str(),
                               section_type, std::move(regions)));
}